

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::BinaryLogLoss::backward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  FBinaryLogLossBackward local_d4;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  CwiseBinaryOp<cnn::FBinaryLogLossBackward,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_70;
  
  Tensor::operator*(&local_90,
                    (xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[i]);
  Tensor::operator*(&local_b0,
                    (xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[1 - i]);
  local_d4.d = *dEdf->v;
  Eigen::
  CwiseBinaryOp<cnn::FBinaryLogLossBackward,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
  ::CwiseBinaryOp(&local_70,&local_90,&local_b0,&local_d4);
  Tensor::operator*(&local_d0,dEdxi);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>> *)
             &local_d0,
             (MatrixBase<Eigen::CwiseBinaryOp<cnn::FBinaryLogLossBackward,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)&local_70);
  return;
}

Assistant:

void BinaryLogLoss::backward_impl(const vector<const Tensor*>& xs,
                  const Tensor& fx,
                  const Tensor& dEdf,
                  unsigned i,
                  Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  *dEdxi += (**xs[i]).binaryExpr(**xs[1-i], FBinaryLogLossBackward(dEdf.v[0]));
#endif
}